

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_logic.cc
# Opt level: O0

bool __thiscall
CLogicSocket::_HandleRegister
          (CLogicSocket *this,lp_connection_t pConn,LPSTRUC_MSG_HEADER pMsgHeader,char *pPkgBody,
          unsigned_short iBodyLength)

{
  SourceFile file;
  uint16_t uVar1;
  LogLevel LVar2;
  int iVar3;
  uint32_t uVar4;
  CCRC32 *this_00;
  void *__dest;
  _func_void *p_Var5;
  long in_RCX;
  void *in_RDX;
  Logger *in_RDI;
  short in_R8W;
  LPSTRUCT_REGISTER p_sendInfo;
  char *p_sendbuf;
  int iSendLen;
  CCRC32 *p_crc32;
  CMemory *p_memory;
  LPCOMM_PKG_HEADER pPkgHeader;
  LPSTRUCT_REGISTER p_RecvInfo;
  MutexLockGuard lock;
  int iRecvLen;
  undefined4 in_stack_ffffffffffffef58;
  undefined1 ifmemset;
  int in_stack_ffffffffffffef5c;
  undefined4 in_stack_ffffffffffffef60;
  undefined4 in_stack_ffffffffffffef64;
  char (*in_stack_ffffffffffffef68) [101];
  SourceFile *in_stack_ffffffffffffef70;
  char *in_stack_ffffffffffffff68;
  CSocekt *in_stack_ffffffffffffff70;
  bool local_1;
  
  LVar2 = muduo::Logger::logLevel();
  if ((int)LVar2 < 3) {
    muduo::Logger::SourceFile::SourceFile<101>(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
    file._8_8_ = in_stack_ffffffffffffef70;
    file.data_ = *in_stack_ffffffffffffef68;
    muduo::Logger::Logger
              ((Logger *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),file,
               in_stack_ffffffffffffef5c);
    muduo::Logger::stream((Logger *)&stack0xffffffffffffeff8);
    muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffef70,*in_stack_ffffffffffffef68);
    muduo::Logger::~Logger(in_RDI);
  }
  if (in_RCX == 0) {
    local_1 = false;
  }
  else if (in_R8W == 100) {
    muduo::MutexLockGuard::MutexLockGuard
              ((MutexLockGuard *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
               (MutexLock *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
    ifmemset = (undefined1)((uint)in_stack_ffffffffffffef58 >> 0x18);
    CMemory::GetInstance();
    this_00 = CCRC32::GetInstance();
    __dest = CMemory::AllocMemory
                       ((CMemory *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                        in_stack_ffffffffffffef5c,(bool)ifmemset);
    memcpy(__dest,in_RDX,(size_t)(in_RDI->impl_).stream_.buffer_.cookie_);
    p_Var5 = (_func_void *)((long)__dest + (long)(in_RDI->impl_).stream_.buffer_.cookie_);
    *(uint16_t *)(p_Var5 + 2) = 5;
    uVar1 = htons(*(uint16_t *)(p_Var5 + 2));
    *(uint16_t *)(p_Var5 + 2) = uVar1;
    uVar1 = htons((short)*(undefined4 *)&(in_RDI->impl_).stream_ - 0x218);
    *(uint16_t *)p_Var5 = uVar1;
    iVar3 = CCRC32::Get_CRC(this_00,(uchar *)((long)__dest +
                                             (long)((in_RDI->impl_).stream_.buffer_.cookie_ +
                                                   *(long *)&(in_RDI->impl_).stream_)),65000);
    *(int *)(p_Var5 + 4) = iVar3;
    uVar4 = htonl(*(uint32_t *)(p_Var5 + 4));
    *(uint32_t *)(p_Var5 + 4) = uVar4;
    CSocekt::msgSend(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_1 = true;
    muduo::MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x142a69);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CLogicSocket::_HandleRegister(lp_connection_t pConn,LPSTRUC_MSG_HEADER pMsgHeader,char *pPkgBody,unsigned short iBodyLength)
{
    LOG_INFO << "执行了CLogicSocket::_HandleRegister()!";
     //(1)首先判断包体的合法性
    if(pPkgBody == NULL) //具体看客户端服务器约定，如果约定这个命令[msgCode]必须带包体，那么如果不带包体，就认为是恶意包，直接不处理    
    {        
        return false;
    }
		    
    int iRecvLen = sizeof(STRUCT_REGISTER); 
    if(iRecvLen != iBodyLength) //发送过来的结构大小不对，认为是恶意包，直接不处理
    {     
        return false; 
    }

    //(2)对于同一个用户，可能同时发送来多个请求过来，造成多个线程同时为该 用户服务，比如以网游为例，用户要在商店中买A物品，又买B物品，而用户的钱 只够买A或者B，不够同时买A和B呢？
       //那如果用户发送购买命令过来买了一次A，又买了一次B，如果是两个线程来执行同一个用户的这两次不同的购买命令，很可能造成这个用户购买成功了 A，又购买成功了 B
       //所以，为了稳妥起见，针对某个用户的命令，我们一般都要互斥,我们需要增加临界的变量于ngx_connection_s结构中
  //  CLock lock(&pConn->logicPorcMutex); //凡是和本用户有关的访问都互斥
    muduo::MutexLockGuard  lock(pConn->logicPorcMutex);
    
    //(3)取得了整个发送过来的数据
    LPSTRUCT_REGISTER p_RecvInfo = (LPSTRUCT_REGISTER)pPkgBody; 

    //(4)这里可能要考虑 根据业务逻辑，进一步判断收到的数据的合法性，
       //当前该玩家的状态是否适合收到这个数据等等【比如如果用户没登陆，它就不适合购买物品等等】
        //这里大家自己发挥，自己根据业务需要来扩充代码，老师就不带着大家扩充了。。。。。。。。。。。。
    //。。。。。。。。

    //(5)给客户端返回数据时，一般也是返回一个结构，这个结构内容具体由客户端/服务器协商，这里我们就以给客户端也返回同样的 STRUCT_REGISTER 结构来举例    
    //LPSTRUCT_REGISTER pFromPkgHeader =  (LPSTRUCT_REGISTER)(((char *)pMsgHeader)+m_iLenMsgHeader);	//指向收到的包的包头，其中数据后续可能要用到
	LPCOMM_PKG_HEADER pPkgHeader;	
	CMemory  *p_memory = CMemory::GetInstance();
	CCRC32   *p_crc32 = CCRC32::GetInstance();
    int iSendLen = sizeof(STRUCT_REGISTER);  
    //a)分配要发送出去的包的内存

    iSendLen = 65000; //unsigned最大也就是这个值
    char *p_sendbuf = (char *)p_memory->AllocMemory(m_iLenMsgHeader+m_iLenPkgHeader+iSendLen,false);//准备发送的格式，这里是 消息头+包头+包体
    //b)填充消息头
    memcpy(p_sendbuf,pMsgHeader,m_iLenMsgHeader);                   //消息头直接拷贝到这里来
    //c)填充包头
    pPkgHeader = (LPCOMM_PKG_HEADER)(p_sendbuf+m_iLenMsgHeader);    //指向包头
    pPkgHeader->msgCode = _CMD_REGISTER;	                        //消息代码，可以统一在ngx_logiccomm.h中定义
    pPkgHeader->msgCode = htons(pPkgHeader->msgCode);	            //htons主机序转网络序 
    pPkgHeader->pkgLen  = htons(m_iLenPkgHeader + iSendLen);        //整个包的尺寸【包头+包体尺寸】 
    //d)填充包体
    LPSTRUCT_REGISTER p_sendInfo = (LPSTRUCT_REGISTER)(p_sendbuf+m_iLenMsgHeader+m_iLenPkgHeader);	//跳过消息头，跳过包头，就是包体了
    //。。。。。这里根据需要，填充要发回给客户端的内容,int类型要使用htonl()转，short类型要使用htons()转；
    
    //e)包体内容全部确定好后，计算包体的crc32值
    pPkgHeader->crc32   = p_crc32->Get_CRC((unsigned char *)p_sendInfo,iSendLen);
    pPkgHeader->crc32   = htonl(pPkgHeader->crc32);		

    //f)发送数据包
    msgSend(p_sendbuf);

    return true;
}